

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void parse_new_section(parse_state *state,int kw,int nargs,char **args)

{
  int iVar1;
  size_t sVar2;
  listnode *plVar3;
  ushort **ppuVar4;
  code *pcVar5;
  char cVar6;
  char *pcVar7;
  listnode *plVar8;
  ulong uVar9;
  
  if (nargs < 2) {
    pcVar7 = "";
  }
  else {
    pcVar7 = args[1];
  }
  printf("[ %s %s ]\n",*args,pcVar7);
  if (kw == 0x15) {
    if (nargs < 2) {
      pcVar7 = "actions must have a trigger\n";
LAB_00106c0f:
      plVar3 = (listnode *)0x0;
      parse_error(state,pcVar7);
    }
    else {
      if (nargs != 2) {
        pcVar7 = "actions may not have extra parameters\n";
        goto LAB_00106c0f;
      }
      plVar3 = (listnode *)calloc(1,0x58);
      plVar3[3].prev = (listnode *)args[1];
      list_init(plVar3 + 4);
      list_add_tail(&action_list,plVar3);
    }
    state->context = plVar3;
    if (plVar3 != (listnode *)0x0) {
      pcVar5 = parse_line_action;
      goto LAB_00106c66;
    }
  }
  else if (kw == 0x19) {
    if (nargs < 3) {
      pcVar7 = "services must have a name and a program\n";
LAB_00106b26:
      plVar8 = (listnode *)0x0;
      parse_error(state,pcVar7);
    }
    else {
      plVar3 = (listnode *)args[1];
      sVar2 = strlen((char *)plVar3);
      if (sVar2 < 0x11) {
        cVar6 = *(char *)&plVar3->next;
        if (cVar6 != '\0') {
          ppuVar4 = __ctype_b_loc();
          plVar8 = plVar3;
          do {
            plVar8 = (listnode *)((long)&plVar8->next + 1);
            if (((((*ppuVar4)[cVar6] & 8) == 0) && (cVar6 != '_')) && (cVar6 != '-'))
            goto LAB_00106b5c;
            cVar6 = *(char *)&plVar8->next;
          } while (cVar6 != '\0');
        }
        plVar8 = &service_list;
        do {
          plVar8 = plVar8->next;
          if (plVar8 == &service_list) {
            plVar8 = (listnode *)0x0;
            break;
          }
          iVar1 = strcmp((char *)plVar8[1].next,(char *)plVar3);
        } while (iVar1 != 0);
        if (plVar8 == (listnode *)0x0) {
          uVar9 = (ulong)(nargs - 2U);
          plVar8 = (listnode *)calloc(1,uVar9 * 8 + 0xf0);
          if (plVar8 == (listnode *)0x0) {
            pcVar7 = "out of memory\n";
            goto LAB_00106b26;
          }
          plVar8[1].next = plVar3;
          plVar8[1].prev = (listnode *)"default";
          memcpy(&plVar8[0xe].prev,args + 2,uVar9 * 8);
          (&plVar8[0xe].prev)[uVar9] = (listnode *)0x0;
          *(uint *)&plVar8[0xe].next = nargs - 2U;
          plVar8[0xb].next = (listnode *)"onrestart";
          list_init((listnode *)&plVar8[0xb].prev);
          list_add_tail(&service_list,plVar8);
          goto LAB_00106c4d;
        }
        pcVar7 = "ignored duplicate definition of service \'%s\'\n";
      }
      else {
LAB_00106b5c:
        pcVar7 = "invalid service name \'%s\'\n";
      }
      plVar8 = (listnode *)0x0;
      parse_error(state,pcVar7,plVar3);
    }
LAB_00106c4d:
    state->context = plVar8;
    if (plVar8 != (listnode *)0x0) {
      pcVar5 = parse_line_service;
      goto LAB_00106c66;
    }
  }
  pcVar5 = parse_line_no_op;
LAB_00106c66:
  state->parse_line = pcVar5;
  return;
}

Assistant:

void parse_new_section(struct parse_state *state, int kw,
                       int nargs, char **args)
{
    printf("[ %s %s ]\n", args[0],
           nargs > 1 ? args[1] : "");
    switch(kw) {
    case K_service:
        state->context = parse_service(state, nargs, args);
        if (state->context) {
            state->parse_line = parse_line_service;
            return;
        }
        break;
    case K_on:
        state->context = parse_action(state, nargs, args);
        if (state->context) {
            state->parse_line = parse_line_action;
            return;
        }
        break;
    }
    state->parse_line = parse_line_no_op;
}